

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

art_key_type __thiscall
unodb::detail::
basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>::
get_key(basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
        *this)

{
  key_view key_;
  basic_leaf<std::span<const_std::byte,_18446744073709551615UL>,_unodb::detail::olc_node_header>
  *this_local;
  
  key_ = get_key_view(this);
  basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)&this_local,key_)
  ;
  return (anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
          )(anon_union_16_2_3c23a32d_for_basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>_1
            )_this_local;
}

Assistant:

constexpr auto get_key() const noexcept {
    if constexpr (std::is_same_v<Key, key_view>) {
      return art_key_type{get_key_view()};
    } else {
      // Use memcpy since alignment is not guaranteed because the
      // [key] is not an explicit part of the leaf data structure.
      //
      // TODO(thompsonbry) memory align leaf::data[0] to 8 bytes?
      Key u{};
      std::memcpy(&u, data, sizeof(u));
      // Note: The encoded key is stored in the leaf.  Since the
      // art_key constructor encodes the key, we need to decode the
      // key before calling the constructor.
      return art_key_type{bswap(u)};
    }
  }